

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O0

void __thiscall
Descriptor_Parse_Taproot_tapleaf_pubkey_Test::TestBody
          (Descriptor_Parse_Taproot_tapleaf_pubkey_Test *this)

{
  bool bVar1;
  char *pcVar2;
  reference this_00;
  char *pcVar3;
  char *in_R9;
  AssertionResult gtest_ar_10;
  CfdException *except_1;
  AssertHelper local_13a0;
  Message local_1398;
  bool local_1389;
  undefined1 local_1388 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_1210;
  Message local_1208;
  Script local_1200;
  string local_11c8;
  undefined1 local_11a8 [8];
  AssertionResult gtest_ar_9;
  Message local_1190;
  string local_1188;
  undefined1 local_1168 [8];
  AssertionResult gtest_ar_8;
  Message local_1150;
  string local_1148;
  undefined1 local_1128 [8];
  AssertionResult gtest_ar_7;
  Message local_1110;
  string local_1108;
  undefined1 local_10e8 [8];
  AssertionResult gtest_ar_6;
  Message local_10d0;
  undefined1 local_10c8 [8];
  AssertionResult gtest_ar_5;
  Message local_10b0;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  local_10a8;
  SchnorrPubkey local_1090;
  AssertHelper local_1078;
  Message local_1070;
  Address local_1068;
  string local_ef0;
  undefined1 local_ed0 [8];
  AssertionResult gtest_ar_4;
  Message local_eb8;
  HashType local_eb0 [2];
  undefined1 local_ea8 [8];
  AssertionResult gtest_ar_3;
  Message local_e90;
  AddressType local_e88 [2];
  undefined1 local_e80 [8];
  AssertionResult gtest_ar_2;
  Message local_e68;
  TaprootScriptTree local_e60;
  AssertHelper local_dd0;
  Message local_dc8;
  string local_dc0;
  AssertHelper local_da0;
  Message local_d98;
  Script local_d90;
  string local_d58;
  AssertHelper local_d38;
  Message local_d30;
  bool local_d21;
  undefined1 local_d20 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_cf0;
  Message local_ce8;
  bool local_cd9;
  undefined1 local_cd8 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_ca8;
  Message local_ca0;
  bool local_c91;
  undefined1 local_c90 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_c60;
  Message local_c58;
  bool local_c49;
  undefined1 local_c48 [8];
  AssertionResult gtest_ar__2;
  Message local_c30;
  uint32_t local_c28 [2];
  undefined1 local_c20 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_bf0;
  Message local_be8;
  bool local_bd9;
  undefined1 local_bd8 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_ba8;
  Message local_ba0;
  bool local_b91;
  undefined1 local_b90 [8];
  AssertionResult gtest_ar_;
  Message local_b78 [2];
  DescriptorScriptReference local_b68;
  AssertionResult gtest_ar;
  CfdException *except;
  NetType local_684;
  undefined1 local_680 [4];
  NetType nettype;
  SchnorrPubkey pubkey;
  TaprootScriptTree tree;
  DescriptorScriptReference script_ref;
  string local_280 [8];
  string desc_str;
  Script locking_script;
  Descriptor desc;
  undefined1 local_b8 [8];
  string descriptor2;
  undefined1 local_90 [8];
  string descriptor1;
  string local_68 [8];
  string pubkey_hex;
  allocator local_31;
  string local_30 [8];
  string internal_pubkey_hex;
  Descriptor_Parse_Taproot_tapleaf_pubkey_Test *this_local;
  
  internal_pubkey_hex.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_30,"ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_68,"ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a",
             (allocator *)(descriptor1.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(descriptor1.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_90,
             "tr(ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a,pk(8c6f5956c3cc7251d483fc683fa06b22d4e2ddc7496a2590acee36c4a313f816))"
             ,(allocator *)(descriptor2.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(descriptor2.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_b8,
             "tr(ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a, {})",
             (allocator *)(desc.root_node_.parent_kind_.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(desc.root_node_.parent_kind_.field_2._M_local_buf + 0xf));
  cfd::core::Descriptor::Descriptor
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Script::Script((Script *)((long)&desc_str.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_280,"",
             (allocator *)
             ((long)&script_ref.addr_prefixes_.
                     super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&script_ref.addr_prefixes_.
                     super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::DescriptorScriptReference::DescriptorScriptReference
            ((DescriptorScriptReference *)
             &tree.nodes_.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::TaprootScriptTree::TaprootScriptTree
            ((TaprootScriptTree *)
             &pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)local_680);
  local_684 = kRegtest;
  cfd::core::Descriptor::Parse
            ((Descriptor *)&except,(string *)local_90,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0);
  cfd::core::Descriptor::operator=
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(Descriptor *)&except);
  cfd::core::Descriptor::~Descriptor((Descriptor *)&except);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetReference
                (&local_b68,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x0);
      cfd::core::DescriptorScriptReference::operator=
                ((DescriptorScriptReference *)
                 &tree.nodes_.
                  super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_b68);
      cfd::core::DescriptorScriptReference::~DescriptorScriptReference(&local_b68);
    }
  }
  else {
    testing::Message::Message(local_b78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x463,
               "Expected: script_ref = desc.GetReference() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,local_b78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(local_b78);
  }
  local_b91 = cfd::core::DescriptorScriptReference::HasKey
                        ((DescriptorScriptReference *)
                         &tree.nodes_.
                          super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_b90,&local_b91,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b90);
  if (!bVar1) {
    testing::Message::Message(&local_ba0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_b90,
               (AssertionResult *)"script_ref.HasKey()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_ba8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x464,pcVar2);
    testing::internal::AssertHelper::operator=(&local_ba8,&local_ba0);
    testing::internal::AssertHelper::~AssertHelper(&local_ba8);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_ba0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b90);
  local_bd9 = cfd::core::DescriptorScriptReference::HasAddress
                        ((DescriptorScriptReference *)
                         &tree.nodes_.
                          super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_bd8,&local_bd9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bd8);
  if (!bVar1) {
    testing::Message::Message(&local_be8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_bd8,
               (AssertionResult *)"script_ref.HasAddress()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_bf0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x465,pcVar2);
    testing::internal::AssertHelper::operator=(&local_bf0,&local_be8);
    testing::internal::AssertHelper::~AssertHelper(&local_bf0);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_be8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_bd8);
  local_c28[1] = 1;
  local_c28[0] = cfd::core::DescriptorScriptReference::GetKeyNum
                           ((DescriptorScriptReference *)
                            &tree.nodes_.
                             super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((EqHelper<false> *)local_c20,"1","script_ref.GetKeyNum()",(int *)(local_c28 + 1),
             local_c28);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c20);
  if (!bVar1) {
    testing::Message::Message(&local_c30);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x466,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_c30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_c30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c20);
  bVar1 = cfd::core::DescriptorScriptReference::HasChild
                    ((DescriptorScriptReference *)
                     &tree.nodes_.
                      super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_c49 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_c48,&local_c49,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c48);
  if (!bVar1) {
    testing::Message::Message(&local_c58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_c48,
               (AssertionResult *)"script_ref.HasChild()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x467,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c60,&local_c58);
    testing::internal::AssertHelper::~AssertHelper(&local_c60);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_c58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c48);
  bVar1 = cfd::core::DescriptorScriptReference::HasReqNum
                    ((DescriptorScriptReference *)
                     &tree.nodes_.
                      super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_c91 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_c90,&local_c91,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c90);
  if (!bVar1) {
    testing::Message::Message(&local_ca0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_c90,
               (AssertionResult *)"script_ref.HasReqNum()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_ca8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x468,pcVar2);
    testing::internal::AssertHelper::operator=(&local_ca8,&local_ca0);
    testing::internal::AssertHelper::~AssertHelper(&local_ca8);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_ca0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c90);
  bVar1 = cfd::core::DescriptorScriptReference::HasRedeemScript
                    ((DescriptorScriptReference *)
                     &tree.nodes_.
                      super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_cd9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_cd8,&local_cd9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cd8);
  if (!bVar1) {
    testing::Message::Message(&local_ce8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_cd8,
               (AssertionResult *)"script_ref.HasRedeemScript()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_cf0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x469,pcVar2);
    testing::internal::AssertHelper::operator=(&local_cf0,&local_ce8);
    testing::internal::AssertHelper::~AssertHelper(&local_cf0);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_ce8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_cd8);
  local_d21 = cfd::core::DescriptorScriptReference::HasScriptTree
                        ((DescriptorScriptReference *)
                         &tree.nodes_.
                          super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_d20,&local_d21,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d20);
  if (!bVar1) {
    testing::Message::Message(&local_d30);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d58,(internal *)local_d20,(AssertionResult *)"script_ref.HasScriptTree()",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x46a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d38,&local_d30);
    testing::internal::AssertHelper::~AssertHelper(&local_d38);
    std::__cxx11::string::~string((string *)&local_d58);
    testing::Message::~Message(&local_d30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d20);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetLockingScript
                (&local_d90,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cfd::core::Script::operator=((Script *)((long)&desc_str.field_2 + 8),&local_d90);
      cfd::core::Script::~Script(&local_d90);
    }
  }
  else {
    testing::Message::Message(&local_d98);
    testing::internal::AssertHelper::AssertHelper
              (&local_da0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x46b,
               "Expected: locking_script = desc.GetLockingScript() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_da0,&local_d98);
    testing::internal::AssertHelper::~AssertHelper(&local_da0);
    testing::Message::~Message(&local_d98);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::ToString_abi_cxx11_
                (&local_dc0,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,false);
      std::__cxx11::string::operator=(local_280,(string *)&local_dc0);
      std::__cxx11::string::~string((string *)&local_dc0);
    }
  }
  else {
    testing::Message::Message(&local_dc8);
    testing::internal::AssertHelper::AssertHelper
              (&local_dd0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x46c,
               "Expected: desc_str = desc.ToString(false) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_dd0,&local_dc8);
    testing::internal::AssertHelper::~AssertHelper(&local_dd0);
    testing::Message::~Message(&local_dc8);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::DescriptorScriptReference::GetScriptTree
                (&local_e60,
                 (DescriptorScriptReference *)
                 &tree.nodes_.
                  super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cfd::core::TaprootScriptTree::operator=
                ((TaprootScriptTree *)
                 &pubkey.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_e60);
      cfd::core::TaprootScriptTree::~TaprootScriptTree(&local_e60);
    }
  }
  else {
    testing::Message::Message(&local_e68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x46d,
               "Expected: tree = script_ref.GetScriptTree() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_e68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_e68);
  }
  local_e88[1] = 7;
  local_e88[0] = cfd::core::DescriptorScriptReference::GetAddressType
                           ((DescriptorScriptReference *)
                            &tree.nodes_.
                             super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            ((EqHelper<false> *)local_e80,"AddressType::kTaprootAddress",
             "script_ref.GetAddressType()",local_e88 + 1,local_e88);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e80);
  if (!bVar1) {
    testing::Message::Message(&local_e90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x46e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_e90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_e90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e80);
  local_eb0[1] = 6;
  local_eb0[0] = cfd::core::DescriptorScriptReference::GetHashType
                           ((DescriptorScriptReference *)
                            &tree.nodes_.
                             super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<cfd::core::HashType,cfd::core::HashType>
            ((EqHelper<false> *)local_ea8,"HashType::kTaproot","script_ref.GetHashType()",
             local_eb0 + 1,local_eb0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ea8);
  if (!bVar1) {
    testing::Message::Message(&local_eb8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ea8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x46f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_eb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_eb8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ea8);
  cfd::core::DescriptorScriptReference::GenerateAddress
            (&local_1068,
             (DescriptorScriptReference *)
             &tree.nodes_.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,local_684);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_ef0,&local_1068);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_ed0,"script_ref.GenerateAddress(nettype).GetAddress().c_str()",
             "\"bcrt1p2druqmxfa49j9ph0ea8d9y4gzrhy2x7u2zj0p2622d9r7k28v02s6x9jx3\"",pcVar2,
             "bcrt1p2druqmxfa49j9ph0ea8d9y4gzrhy2x7u2zj0p2622d9r7k28v02s6x9jx3");
  std::__cxx11::string::~string((string *)&local_ef0);
  cfd::core::Address::~Address(&local_1068);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ed0);
  if (!bVar1) {
    testing::Message::Message(&local_1070);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ed0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1078,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x471,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1078,&local_1070);
    testing::internal::AssertHelper::~AssertHelper(&local_1078);
    testing::Message::~Message(&local_1070);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ed0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::DescriptorScriptReference::GetKeyList
                (&local_10a8,
                 (DescriptorScriptReference *)
                 &tree.nodes_.
                  super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_00 = std::
                vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
                ::operator[](&local_10a8,0);
      cfd::core::DescriptorKeyReference::GetSchnorrPubkey(&local_1090,this_00);
      cfd::core::SchnorrPubkey::operator=((SchnorrPubkey *)local_680,&local_1090);
      cfd::core::SchnorrPubkey::~SchnorrPubkey(&local_1090);
      std::
      vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
      ::~vector(&local_10a8);
    }
  }
  else {
    testing::Message::Message(&local_10b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x472,
               "Expected: pubkey = script_ref.GetKeyList()[0].GetSchnorrPubkey() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_10b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_10b0);
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_10c8,"desc_str.c_str()","descriptor1.c_str()",pcVar2,pcVar3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10c8);
  if (!bVar1) {
    testing::Message::Message(&local_10d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_10c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x473,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_10d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_10d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_10c8);
  cfd::core::Script::ToString_abi_cxx11_(&local_1108,(Script *)((long)&desc_str.field_2 + 8));
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_10e8,"locking_script.ToString().c_str()",
             "\"1 5347c06cc9ed4b2286efcf4ed292a810ee451bdc50a4f0ab4a534a3f594763d5\"",pcVar2,
             "1 5347c06cc9ed4b2286efcf4ed292a810ee451bdc50a4f0ab4a534a3f594763d5");
  std::__cxx11::string::~string((string *)&local_1108);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10e8);
  if (!bVar1) {
    testing::Message::Message(&local_1110);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_10e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x475,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_1110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_1110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_10e8);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_1148,(SchnorrPubkey *)local_680);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1128,"pubkey.GetHex().c_str()","pubkey_hex.c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_1148);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1128);
  if (!bVar1) {
    testing::Message::Message(&local_1150);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1128);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x476,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_1150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_1150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1128);
  cfd::core::TapBranch::ToString_abi_cxx11_
            (&local_1188,
             (TapBranch *)
             &pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1168,"tree.ToString().c_str()",
             "\"tl(208c6f5956c3cc7251d483fc683fa06b22d4e2ddc7496a2590acee36c4a313f816ac)\"",pcVar2,
             "tl(208c6f5956c3cc7251d483fc683fa06b22d4e2ddc7496a2590acee36c4a313f816ac)");
  std::__cxx11::string::~string((string *)&local_1188);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1168);
  if (!bVar1) {
    testing::Message::Message(&local_1190);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1168);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x478,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_1190);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_1190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1168);
  cfd::core::TapBranch::GetScript
            (&local_1200,
             (TapBranch *)
             &pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Script::GetHex_abi_cxx11_(&local_11c8,&local_1200);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_11a8,"tree.GetScript().GetHex().c_str()",
             "\"208c6f5956c3cc7251d483fc683fa06b22d4e2ddc7496a2590acee36c4a313f816ac\"",pcVar2,
             "208c6f5956c3cc7251d483fc683fa06b22d4e2ddc7496a2590acee36c4a313f816ac");
  std::__cxx11::string::~string((string *)&local_11c8);
  cfd::core::Script::~Script(&local_1200);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_11a8);
  if (!bVar1) {
    testing::Message::Message(&local_1208);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_11a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x47a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1210,&local_1208);
    testing::internal::AssertHelper::~AssertHelper(&local_1210);
    testing::Message::~Message(&local_1208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_11a8);
  cfd::core::Descriptor::Parse
            ((Descriptor *)&gtest_ar__6.message_,(string *)local_b8,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0);
  cfd::core::Descriptor::operator=
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(Descriptor *)&gtest_ar__6.message_
            );
  cfd::core::Descriptor::~Descriptor((Descriptor *)&gtest_ar__6.message_);
  local_1389 = false;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1388,&local_1389,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1388);
  if (!bVar1) {
    testing::Message::Message(&local_1398);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&except_1,(internal *)local_1388,(AssertionResult *)0x6a1860,"false","true"
               ,in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_13a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x47e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_13a0,&local_1398);
    testing::internal::AssertHelper::~AssertHelper(&local_13a0);
    std::__cxx11::string::~string((string *)&except_1);
    testing::Message::~Message(&local_1398);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1388);
  cfd::core::SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)local_680);
  cfd::core::TaprootScriptTree::~TaprootScriptTree
            ((TaprootScriptTree *)
             &pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::DescriptorScriptReference::~DescriptorScriptReference
            ((DescriptorScriptReference *)
             &tree.nodes_.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string(local_280);
  cfd::core::Script::~Script((Script *)((long)&desc_str.field_2 + 8));
  cfd::core::Descriptor::~Descriptor
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

TEST(Descriptor, Parse_Taproot_tapleaf_pubkey) {
  //   pubkey: '04ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a116bc35b3f8d748aea5dfad083a73961908797c97fc0ca4f8d874aba9778fc77',
  //   privkey: '5JB4Tt43VA4qbBVRtf88CVKTkJ82pC6mhm9aHywDG27htnFHgqC'
  std::string internal_pubkey_hex = "ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a";
  std::string pubkey_hex = "ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a";
  std::string descriptor1 = "tr(ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a,pk(8c6f5956c3cc7251d483fc683fa06b22d4e2ddc7496a2590acee36c4a313f816))";
  std::string descriptor2 = "tr(ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a, {})";
  Descriptor desc;
  Script locking_script;
  std::string desc_str = "";
  DescriptorScriptReference script_ref;
  TaprootScriptTree tree;
  SchnorrPubkey pubkey;
  NetType nettype = NetType::kRegtest;

  try {
    desc = Descriptor::Parse(descriptor1);
  } catch (const CfdException& except) {
    EXPECT_STREQ(except.what(), "");
  }

  EXPECT_NO_THROW(script_ref = desc.GetReference());
  EXPECT_TRUE(script_ref.HasKey());
  EXPECT_TRUE(script_ref.HasAddress());
  EXPECT_EQ(1, script_ref.GetKeyNum());
  EXPECT_FALSE(script_ref.HasChild());
  EXPECT_FALSE(script_ref.HasReqNum());
  EXPECT_FALSE(script_ref.HasRedeemScript());
  EXPECT_TRUE(script_ref.HasScriptTree());
  EXPECT_NO_THROW(locking_script = desc.GetLockingScript());
  EXPECT_NO_THROW(desc_str = desc.ToString(false));
  EXPECT_NO_THROW(tree = script_ref.GetScriptTree());
  EXPECT_EQ(AddressType::kTaprootAddress, script_ref.GetAddressType());
  EXPECT_EQ(HashType::kTaproot, script_ref.GetHashType());
  EXPECT_STREQ(script_ref.GenerateAddress(nettype).GetAddress().c_str(),
      "bcrt1p2druqmxfa49j9ph0ea8d9y4gzrhy2x7u2zj0p2622d9r7k28v02s6x9jx3");
  EXPECT_NO_THROW(pubkey = script_ref.GetKeyList()[0].GetSchnorrPubkey());
  EXPECT_STREQ(desc_str.c_str(), descriptor1.c_str());
  EXPECT_STREQ(locking_script.ToString().c_str(),
      "1 5347c06cc9ed4b2286efcf4ed292a810ee451bdc50a4f0ab4a534a3f594763d5");
  EXPECT_STREQ(pubkey.GetHex().c_str(), pubkey_hex.c_str());
  EXPECT_STREQ(tree.ToString().c_str(),
      "tl(208c6f5956c3cc7251d483fc683fa06b22d4e2ddc7496a2590acee36c4a313f816ac)");
  EXPECT_STREQ(tree.GetScript().GetHex().c_str(),
      "208c6f5956c3cc7251d483fc683fa06b22d4e2ddc7496a2590acee36c4a313f816ac");

  try {
    desc = Descriptor::Parse(descriptor2);
    EXPECT_TRUE(false);
  } catch (const CfdException& except) {
    EXPECT_STREQ("Failed to taproot. empty script.", except.what());
  }
}